

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::setSortingEnabled(QTreeView *this,bool enable)

{
  long lVar1;
  void **ppvVar2;
  void **ppvVar3;
  undefined8 uVar4;
  int column;
  SortOrder order;
  undefined4 *puVar5;
  undefined7 in_register_00000031;
  QTreeViewPrivate *d;
  long in_FS_OFFSET;
  undefined8 local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QHeaderView::setSortIndicatorShown(*(QHeaderView **)(lVar1 + 0x590),enable);
  QHeaderView::setSectionsClickable
            (*(QHeaderView **)
              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.field_0x8 + 0x590),enable);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    QObject::disconnect((Connection *)(lVar1 + 0x678));
  }
  else {
    column = QHeaderView::sortIndicatorSection
                       (*(QHeaderView **)
                         (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x590));
    order = QHeaderView::sortIndicatorOrder
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x590));
    sortByColumn(this,column,order);
    ppvVar2 = *(void ***)
               (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8 + 0x590);
    local_48 = QHeaderView::sortIndicatorChanged;
    local_40 = 0;
    local_58 = QTreeViewPrivate::sortIndicatorChanged;
    local_50 = (ImplFn)0x0;
    ppvVar3 = *(void ***)(lVar1 + 8);
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QTreeViewPrivate::*)(int,_Qt::SortOrder),_QtPrivate::List<int,_Qt::SortOrder>,_void>
         ::impl;
    *(code **)(puVar5 + 4) = QTreeViewPrivate::sortIndicatorChanged;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_60,ppvVar2,(QObject *)&local_48,ppvVar3,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x80,(QMetaObject *)0x0);
    uVar4 = *(undefined8 *)(lVar1 + 0x678);
    *(undefined8 *)(lVar1 + 0x678) = local_60;
    local_60 = uVar4;
    QMetaObject::Connection::~Connection((Connection *)&local_60);
  }
  *(bool *)(lVar1 + 0x5c3) = enable;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setSortingEnabled(bool enable)
{
    Q_D(QTreeView);
    header()->setSortIndicatorShown(enable);
    header()->setSectionsClickable(enable);
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
        d->sortHeaderConnection =
            QObjectPrivate::connect(header(), &QHeaderView::sortIndicatorChanged,
                                    d, &QTreeViewPrivate::sortIndicatorChanged,
                                    Qt::UniqueConnection);
    } else {
        QObject::disconnect(d->sortHeaderConnection);
    }
    d->sortingEnabled = enable;
}